

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_large.c
# Opt level: O3

void test_read_large(void)

{
  int iVar1;
  int iVar2;
  archive *paVar3;
  archive_entry *entry_00;
  ssize_t v2;
  FILE *__stream;
  size_t v2_00;
  char *pcVar4;
  archive_entry *entry;
  size_t used;
  archive_entry *local_40;
  size_t local_38;
  
  pcVar4 = (char *)0x0;
  do {
    iVar1 = rand();
    testdata[(long)pcVar4] = (uchar)iVar1;
    pcVar4 = pcVar4 + 1;
  } while (pcVar4 != buff1 + 0x74f3d0);
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'3',(uint)(paVar3 != (archive *)0x0),"NULL != (a = archive_write_new())",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'4',(uint)(iVar1 == 0),"0 == archive_write_set_format_ustar(a)",paVar3);
  iVar1 = archive_write_open_memory(paVar3,buff,0xb00000,&local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'5',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar3);
  entry_00 = archive_entry_new();
  local_40 = entry_00;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'6',(uint)(entry_00 != (archive_entry *)0x0),
                   "NULL != (entry = archive_entry_new())",(void *)0x0);
  archive_entry_set_size(entry_00,0xa00000);
  archive_entry_set_mode(entry_00,0x81ff);
  archive_entry_set_pathname(entry_00,"test");
  iVar1 = archive_write_header(paVar3,entry_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L':',(uint)(iVar1 == 0),"0 == archive_write_header(a, entry)",paVar3);
  archive_entry_free(entry_00);
  pcVar4 = (char *)archive_write_data(paVar3,testdata,0xa00000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'<',(uint)(pcVar4 == buff1 + 0x74f3d0),
                   "(int)sizeof(testdata) == archive_write_data(a, testdata, sizeof(testdata))",
                   paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                      ,L'=',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'?',(uint)(paVar3 != (archive *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'@',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",paVar3);
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'A',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_open_memory(paVar3,buff,0xb00000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'B',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, buff, sizeof(buff))",
                   paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'C',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &entry)",paVar3);
  v2 = archive_read_data(paVar3,testdatacopy,0xa00000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                      ,L'E',0xa00000,"sizeof(testdatacopy)",v2,
                      "archive_read_data(a, testdatacopy, sizeof(testdatacopy))",paVar3);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                      ,L'F',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                      ,L'G',testdata,"testdata",testdatacopy,"testdatacopy",0xa00000,
                      "sizeof(testdata)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'J',(uint)(paVar3 != (archive *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'K',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",paVar3);
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'L',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_open_memory(paVar3,buff,0xb00000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'M',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, buff, sizeof(buff))",
                   paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'N',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &entry)",paVar3);
  iVar1 = open("test-read_large.XXXXXX",0x41,0x1ed);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'T',(uint)(0 < iVar1),"0 < tmpfilefd",(void *)0x0);
  iVar2 = archive_read_data_into_fd(paVar3,iVar1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                   ,L'U',(uint)(iVar2 == 0),"0 == archive_read_data_into_fd(a, tmpfilefd)",paVar3);
  close(iVar1);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                      ,L'W',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  __stream = fopen("test-read_large.XXXXXX","rb");
  v2_00 = fread(testdatacopy,1,0xa00000,__stream);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                      ,L'[',0xa00000,"sizeof(testdatacopy)",v2_00,
                      "fread(testdatacopy, 1, sizeof(testdatacopy), f)",(void *)0x0);
  fclose(__stream);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_large.c"
                      ,L']',testdata,"testdata",testdatacopy,"testdatacopy",0xa00000,
                      "sizeof(testdata)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_large)
{
	unsigned int i;
	int tmpfilefd;
	char tmpfilename[] = "test-read_large.XXXXXX";
	size_t used;
	struct archive *a;
	struct archive_entry *entry;
	FILE *f;

	for (i = 0; i < sizeof(testdata); i++)
		testdata[i] = (unsigned char)(rand());

	assert(NULL != (a = archive_write_new()));
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));
	assert(NULL != (entry = archive_entry_new()));
	archive_entry_set_size(entry, sizeof(testdata));
	archive_entry_set_mode(entry, S_IFREG | 0777);
	archive_entry_set_pathname(entry, "test");
	assertA(0 == archive_write_header(a, entry));
	archive_entry_free(entry);
	assertA((int)sizeof(testdata) == archive_write_data(a, testdata, sizeof(testdata)));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, sizeof(buff)));
	assertA(0 == archive_read_next_header(a, &entry));
	assertEqualIntA(a, sizeof(testdatacopy),
	    archive_read_data(a, testdatacopy, sizeof(testdatacopy)));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	assertEqualMem(testdata, testdatacopy, sizeof(testdata));


	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, sizeof(buff)));
	assertA(0 == archive_read_next_header(a, &entry));
#if defined(__BORLANDC__)
	tmpfilefd = open(tmpfilename, O_WRONLY | O_CREAT | O_BINARY);
#else
	tmpfilefd = open(tmpfilename, O_WRONLY | O_CREAT | O_BINARY, 0755);
#endif
	assert(0 < tmpfilefd);
	assertA(0 == archive_read_data_into_fd(a, tmpfilefd));
	close(tmpfilefd);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	f = fopen(tmpfilename, "rb");
	assertEqualInt(sizeof(testdatacopy),
	    fread(testdatacopy, 1, sizeof(testdatacopy), f));
	fclose(f);
	assertEqualMem(testdata, testdatacopy, sizeof(testdata));
}